

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkgitems.cpp
# Opt level: O0

void __thiscall
icu_63::Package::enumDependencies(Package *this,Item *pItem,void *context,CheckDependency *check)

{
  undefined8 uVar1;
  FILE *__stream;
  UBool UVar2;
  int32_t length_00;
  UDataInfo *pUVar3;
  uint8_t *inBytes_00;
  UDataSwapper *ds_00;
  char *pcVar4;
  int32_t length;
  uint8_t *inBytes;
  UDataSwapper *ds;
  undefined1 local_70 [8];
  NativeItem nrb;
  int32_t format;
  UDataInfo *pInfo;
  int local_30;
  UErrorCode errorCode;
  int32_t itemHeaderLength;
  int32_t infoLength;
  CheckDependency *check_local;
  void *context_local;
  Item *pItem_local;
  Package *this_local;
  
  pInfo._4_4_ = U_ZERO_ERROR;
  _itemHeaderLength = check;
  check_local = (CheckDependency *)context;
  context_local = pItem;
  pItem_local = (Item *)this;
  pUVar3 = getDataInfo(pItem->data,pItem->length,&errorCode,&local_30,
                       (UErrorCode *)((long)&pInfo + 4));
  UVar2 = ::U_FAILURE(pInfo._4_4_);
  if ((UVar2 == '\0') && (nrb._36_4_ = getDataFormat(pUVar3->dataFormat), -1 < (int)nrb._36_4_)) {
    if (nrb._36_4_ == 0) {
      NativeItem::NativeItem((NativeItem *)local_70,(Item *)context_local,ures_swap_63);
      pcVar4 = *context_local;
      pUVar3 = NativeItem::getDataInfo((NativeItem *)local_70);
      inBytes_00 = NativeItem::getBytes((NativeItem *)local_70);
      length_00 = NativeItem::getLength((NativeItem *)local_70);
      ures_enumDependencies
                (pcVar4,pUVar3,inBytes_00,length_00,_itemHeaderLength,check_local,this,
                 (UErrorCode *)((long)&pInfo + 4));
      NativeItem::~NativeItem((NativeItem *)local_70);
    }
    else if (nrb._36_4_ == 1) {
      ds_00 = udata_openSwapper_63
                        (pUVar3->isBigEndian,pUVar3->charsetFamily,'\0','\0',
                         (UErrorCode *)((long)&pInfo + 4));
      UVar2 = ::U_FAILURE(pInfo._4_4_);
      __stream = _stderr;
      if (UVar2 != '\0') {
        uVar1 = *context_local;
        pcVar4 = u_errorName_63(pInfo._4_4_);
        fprintf(__stream,"icupkg: udata_openSwapper(\"%s\") failed - %s\n",uVar1,pcVar4);
        exit(pInfo._4_4_);
      }
      ds_00->printError = printError;
      ds_00->printErrorContext = _stderr;
      ucnv_enumDependencies
                (ds_00,*context_local,pUVar3,
                 (uint8_t *)(*(long *)((long)context_local + 8) + (long)local_30),
                 *(int *)((long)context_local + 0x10) - local_30,_itemHeaderLength,check_local,
                 (UErrorCode *)((long)&pInfo + 4));
      udata_closeSwapper_63(ds_00);
    }
    UVar2 = ::U_FAILURE(pInfo._4_4_);
    if (UVar2 != '\0') {
      exit(pInfo._4_4_);
    }
  }
  return;
}

Assistant:

void
Package::enumDependencies(Item *pItem, void *context, CheckDependency check) {
    int32_t infoLength, itemHeaderLength;
    UErrorCode errorCode=U_ZERO_ERROR;
    const UDataInfo *pInfo=getDataInfo(pItem->data, pItem->length, infoLength, itemHeaderLength, &errorCode);
    if(U_FAILURE(errorCode)) {
        return; // should not occur because readFile() checks headers
    }

    // find the data format and call the corresponding function, if any
    int32_t format=getDataFormat(pInfo->dataFormat);
    if(format>=0) {
        switch(format) {
        case FMT_RES:
            {
                /*
                 * Swap the resource bundle (if necessary) so that we can use
                 * the normal runtime uresdata.c code to read it.
                 * We do not want to duplicate that code, especially not together with on-the-fly swapping.
                 */
                NativeItem nrb(pItem, ures_swap);
                ures_enumDependencies(pItem->name, nrb.getDataInfo(), nrb.getBytes(), nrb.getLength(), check, context, this, &errorCode);
                break;
            }
        case FMT_CNV:
            {
                // TODO: share/cache swappers
                UDataSwapper *ds=udata_openSwapper(
                                    (UBool)pInfo->isBigEndian, pInfo->charsetFamily,
                                    U_IS_BIG_ENDIAN, U_CHARSET_FAMILY,
                                    &errorCode);
                if(U_FAILURE(errorCode)) {
                    fprintf(stderr, "icupkg: udata_openSwapper(\"%s\") failed - %s\n",
                            pItem->name, u_errorName(errorCode));
                    exit(errorCode);
                }

                ds->printError=printError;
                ds->printErrorContext=stderr;

                const uint8_t *inBytes=pItem->data+itemHeaderLength;
                int32_t length=pItem->length-itemHeaderLength;

                ucnv_enumDependencies(ds, pItem->name, pInfo, inBytes, length, check, context, &errorCode);
                udata_closeSwapper(ds);
                break;
            }
        default:
            break;
        }

        if(U_FAILURE(errorCode)) {
            exit(errorCode);
        }
    }
}